

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::BufferRenderer::BufferRenderer
          (BufferRenderer *this,TestLog *log,RenderContext *renderContext)

{
  RenderContext *pRVar1;
  bool bVar2;
  ContextType type;
  GLenum GVar3;
  ShaderProgram *pSVar4;
  TestError *this_00;
  long lVar5;
  ProgramSources sources;
  allocator<char> local_142;
  allocator<char> local_141;
  value_type local_140;
  value_type local_120;
  ProgramSources local_100;
  
  this->m_program = (ShaderProgram *)0x0;
  this->m_renderCtx = renderContext;
  this->m_coordBuffer = 0;
  this->m_indexBuffer = 0;
  this->m_vao = 0;
  type.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_300_ES);
  if (bVar2) {
    pSVar4 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = this->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,s_vertexShaderGLES3,&local_141);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,s_fragmentShaderGLES3,&local_142);
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources,&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + 1,&local_140);
    glu::ShaderProgram::ShaderProgram(pSVar4,pRVar1,&local_100);
    this->m_program = pSVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
  }
  else {
    bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_100_ES);
    if (bVar2) {
      pSVar4 = (ShaderProgram *)operator_new(0xd0);
      pRVar1 = this->m_renderCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,s_vertexShaderGLES2,&local_141);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,s_fragmentShaderGLES2,&local_142);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      memset(&local_100,0,0xac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources,&local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources + 1,&local_140);
      glu::ShaderProgram::ShaderProgram(pSVar4,pRVar1,&local_100);
      this->m_program = pSVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_100.attribLocationBindings);
      lVar5 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_100.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
    }
    else {
      bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_330);
      if (!bVar2) goto LAB_01846809;
      pSVar4 = (ShaderProgram *)operator_new(0xd0);
      pRVar1 = this->m_renderCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,s_vertexShaderGL3,&local_141);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,s_fragmentShaderGL3,&local_142);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      memset(&local_100,0,0xac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources,&local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources + 1,&local_140);
      glu::ShaderProgram::ShaderProgram(pSVar4,pRVar1,&local_100);
      this->m_program = pSVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_100.attribLocationBindings);
      lVar5 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_100.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
LAB_01846809:
  if (((uint)type.super_ApiType.m_bits & 0x300) == 0x100) {
    glwGenVertexArrays(1,&this->m_vao);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glGenVertexArrays(1, &m_vao)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x166);
  }
  glwGenBuffers(1,&this->m_coordBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glGenBuffers(1, &m_coordBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x168);
  glwBindBuffer(0x8892,this->m_coordBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x169);
  glwBufferData(0x8892,0x20,s_quadCoords,0x88e4);
  GVar3 = glwGetError();
  glu::checkError(GVar3,
                  "glBufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16a);
  glwGenBuffers(1,&this->m_indexBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glGenBuffers(1, &m_indexBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16c);
  glwBindBuffer(0x8893,this->m_indexBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16d);
  glwBufferData(0x8893,6,&s_quadIndices,0x88e4);
  GVar3 = glwGetError();
  glu::checkError(GVar3,
                  "glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(s_quadIndices), s_quadIndices, GL_STATIC_DRAW)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16e);
  if (((this->m_program->m_program).m_info.linkOk == false) &&
     (glu::operator<<(log,this->m_program), (this->m_program->m_program).m_info.linkOk == false)) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed","m_program->isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
               ,0x173);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

BufferRenderer::BufferRenderer (tcu::TestLog& log, glu::RenderContext& renderContext)
	: m_program		(NULL)
	, m_renderCtx	(renderContext)
	, m_coordBuffer	(0)
	, m_indexBuffer	(0)
	, m_vao			(0)
{
	const glu::ContextType ctxType = renderContext.getType();

	if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_300_ES))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGLES3, s_fragmentShaderGLES3));
	else if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_100_ES))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGLES2, s_fragmentShaderGLES2));
	else if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_330))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGL3, s_fragmentShaderGL3));
	else
		DE_ASSERT(false);

	if (ctxType.getProfile() == glu::PROFILE_CORE)
		GLU_CHECK_CALL(glGenVertexArrays(1, &m_vao));

	GLU_CHECK_CALL(glGenBuffers(1, &m_coordBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glBufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW));

	GLU_CHECK_CALL(glGenBuffers(1, &m_indexBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(s_quadIndices), s_quadIndices, GL_STATIC_DRAW));

	if (!m_program->isOk())
	{
		log << *m_program;
		TCU_CHECK_MSG(m_program->isOk(), "Shader compilation failed");
	}
}